

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClipboard.cpp
# Opt level: O2

void __thiscall PatternClipboard::PatternClipboard(PatternClipboard *this,QObject *parent)

{
  offset_in_QClipboard_to_subr signal;
  Object local_28 [8];
  code *local_20;
  undefined8 uStack_18;
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001f10c8;
  (this->mClip).super__Optional_base<PatternClip,_false,_false>._M_payload.
  super__Optional_payload<PatternClip,_true,_false,_false>.super__Optional_payload_base<PatternClip>
  ._M_engaged = false;
  this->mSettingClipboard = false;
  signal = QGuiApplication::clipboard();
  local_20 = parseClipboard;
  uStack_18 = 0;
  QObject::connect<void(QClipboard::*)(),void(PatternClipboard::*)()>
            (local_28,signal,(Object *)QClipboard::dataChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  parseClipboard(this);
  return;
}

Assistant:

PatternClipboard::PatternClipboard(QObject *parent) :
    QObject(parent),
    mClip(),
    mSettingClipboard(false)
{
    auto clipboard = QGuiApplication::clipboard();
    connect(clipboard, &QClipboard::dataChanged, this, &PatternClipboard::parseClipboard);
    parseClipboard();
}